

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::TraitImplExpr::TraitImplExpr
          (TraitImplExpr *this,Lexer *lexer,Position *pos,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps,
          Token *classTokId,TemplateDecls *templs,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *implTrait,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  bool bVar1;
  pointer this_00;
  TemplateDecls *templs_local;
  Token *classTokId_local;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps_local;
  Position *pos_local;
  Lexer *lexer_local;
  TraitImplExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lexer,EXPR_TRAITIMPL,pos);
  Capable::Capable(&this->super_Capable,caps);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__TraitImplExpr_00176858;
  this->classTokId = classTokId;
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::vector(&this->templs,templs);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr
            (&this->implTrait,implTrait);
  std::__cxx11::
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ::list(&this->functions,functions);
  if (this->classTokId == (Token *)0x0) {
    __assert_fail("this->classTokId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x1ca,
                  "pfederc::TraitImplExpr::TraitImplExpr(const Lexer &, const Position &, std::unique_ptr<Capabilities> &&, const Token *, TemplateDecls &&, std::unique_ptr<Expr> &&, std::list<std::unique_ptr<FuncExpr>> &&)"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->implTrait);
  if (!bVar1) {
    __assert_fail("!!this->implTrait",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x1cb,
                  "pfederc::TraitImplExpr::TraitImplExpr(const Lexer &, const Position &, std::unique_ptr<Capabilities> &&, const Token *, TemplateDecls &&, std::unique_ptr<Expr> &&, std::list<std::unique_ptr<FuncExpr>> &&)"
                 );
  }
  _setTemplateParents(&this->templs,&this->super_Expr);
  this_00 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                      (&this->implTrait);
  Expr::setParent(this_00,&this->super_Expr);
  _setParents<pfederc::FuncExpr>(&this->functions,&this->super_Expr);
  return;
}

Assistant:

TraitImplExpr::TraitImplExpr(const Lexer &lexer, const Position &pos,
    std::unique_ptr<Capabilities> &&caps,
    const Token *classTokId,
    TemplateDecls &&templs,
    std::unique_ptr<Expr> &&implTrait,
    std::list<std::unique_ptr<FuncExpr>> &&functions) noexcept
    : Expr(lexer, ExprType::EXPR_TRAITIMPL, pos), Capable(std::move(caps)), classTokId{classTokId},
      templs(std::move(templs)),
      implTrait(std::move(implTrait)), functions(std::move(functions)) {
  assert(this->classTokId);
  assert(!!this->implTrait);

  _setTemplateParents(this->templs, this);
  this->implTrait->setParent(this);
  _setParents(this->functions, this);
}